

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void emit_class_field_init(JSParseState *s)

{
  int iVar1;
  undefined8 in_RDI;
  JSParseState *unaff_retaddr;
  int label_next;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  uint16_t in_stack_ffffffffffffffee;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint8_t val;
  
  val = (uint8_t)((ulong)in_RDI >> 0x38);
  emit_op(unaff_retaddr,val);
  emit_atom((JSParseState *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
            CONCAT22(in_stack_ffffffffffffffee,in_stack_ffffffffffffffec));
  emit_u16((JSParseState *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
           in_stack_ffffffffffffffee);
  emit_op(unaff_retaddr,val);
  iVar1 = emit_goto((JSParseState *)
                    CONCAT26(in_stack_ffffffffffffffee,
                             CONCAT24(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),0,
                    0x191de6);
  emit_op(unaff_retaddr,val);
  emit_atom((JSParseState *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
            CONCAT22(in_stack_ffffffffffffffee,in_stack_ffffffffffffffec));
  emit_u16((JSParseState *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffee);
  emit_op(unaff_retaddr,val);
  emit_op(unaff_retaddr,val);
  emit_u16((JSParseState *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffee);
  emit_label((JSParseState *)
             CONCAT26(in_stack_ffffffffffffffee,
                      CONCAT24(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),0);
  emit_op(unaff_retaddr,val);
  return;
}

Assistant:

static void emit_class_field_init(JSParseState *s)
{
    int label_next;
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_class_fields_init);
    emit_u16(s, s->cur_func->scope_level);

    /* no need to call the class field initializer if not defined */
    emit_op(s, OP_dup);
    label_next = emit_goto(s, OP_if_false, -1);
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_this);
    emit_u16(s, 0);
    
    emit_op(s, OP_swap);
    
    emit_op(s, OP_call_method);
    emit_u16(s, 0);

    emit_label(s, label_next);
    emit_op(s, OP_drop);
}